

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  long lVar3;
  undefined1 auVar4 [32];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  ulong *puVar42;
  ulong uVar43;
  int iVar44;
  undefined4 uVar45;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar46;
  size_t sVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar69;
  float fVar70;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  undefined1 auVar68 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  float fVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar106 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  uint uVar113;
  uint uVar115;
  uint uVar116;
  uint uVar117;
  undefined1 auVar114 [64];
  undefined1 auVar118 [64];
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  undefined1 local_14c8 [16];
  int local_14ac;
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  ulong local_1478;
  ulong local_1470;
  undefined1 local_1468 [16];
  Scene *local_1458;
  undefined8 uStack_1450;
  ulong local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  ulong local_1420;
  NodeRef *local_1418;
  RayQueryContext *local_1410;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  auVar41 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar58 = ray->tfar;
    if (0.0 <= fVar58) {
      local_1418 = stack + 1;
      aVar2 = (ray->dir).field_0;
      auVar53 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar87._8_4_ = 0x7fffffff;
      auVar87._0_8_ = 0x7fffffff7fffffff;
      auVar87._12_4_ = 0x7fffffff;
      auVar87 = vandps_avx((undefined1  [16])aVar2,auVar87);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar87 = vcmpps_avx(auVar87,auVar92,1);
      auVar87 = vblendvps_avx((undefined1  [16])aVar2,auVar92,auVar87);
      auVar92 = vrcpps_avx(auVar87);
      fVar69 = auVar92._0_4_;
      auVar81._0_4_ = fVar69 * auVar87._0_4_;
      fVar70 = auVar92._4_4_;
      auVar81._4_4_ = fVar70 * auVar87._4_4_;
      fVar71 = auVar92._8_4_;
      auVar81._8_4_ = fVar71 * auVar87._8_4_;
      fVar91 = auVar92._12_4_;
      auVar81._12_4_ = fVar91 * auVar87._12_4_;
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = &DAT_3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar87 = vsubps_avx(auVar93,auVar81);
      uVar45 = *(undefined4 *)&(ray->org).field_0;
      local_1218._4_4_ = uVar45;
      local_1218._0_4_ = uVar45;
      local_1218._8_4_ = uVar45;
      local_1218._12_4_ = uVar45;
      local_1218._16_4_ = uVar45;
      local_1218._20_4_ = uVar45;
      local_1218._24_4_ = uVar45;
      local_1218._28_4_ = uVar45;
      auVar114 = ZEXT3264(local_1218);
      uVar45 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1238._4_4_ = uVar45;
      local_1238._0_4_ = uVar45;
      local_1238._8_4_ = uVar45;
      local_1238._12_4_ = uVar45;
      local_1238._16_4_ = uVar45;
      local_1238._20_4_ = uVar45;
      local_1238._24_4_ = uVar45;
      local_1238._28_4_ = uVar45;
      auVar118 = ZEXT3264(local_1238);
      uVar45 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1258._4_4_ = uVar45;
      local_1258._0_4_ = uVar45;
      local_1258._8_4_ = uVar45;
      local_1258._12_4_ = uVar45;
      local_1258._16_4_ = uVar45;
      local_1258._20_4_ = uVar45;
      local_1258._24_4_ = uVar45;
      local_1258._28_4_ = uVar45;
      auVar120 = ZEXT3264(local_1258);
      auVar82._0_4_ = fVar69 + fVar69 * auVar87._0_4_;
      auVar82._4_4_ = fVar70 + fVar70 * auVar87._4_4_;
      auVar82._8_4_ = fVar71 + fVar71 * auVar87._8_4_;
      auVar82._12_4_ = fVar91 + fVar91 * auVar87._12_4_;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar87 = vshufps_avx(auVar82,auVar82,0);
      local_1278._16_16_ = auVar87;
      local_1278._0_16_ = auVar87;
      auVar128 = ZEXT3264(local_1278);
      auVar87 = vmovshdup_avx(auVar82);
      auVar92 = vshufps_avx(auVar82,auVar82,0x55);
      local_1298._16_16_ = auVar92;
      local_1298._0_16_ = auVar92;
      auVar129 = ZEXT3264(local_1298);
      auVar92 = vshufpd_avx(auVar82,auVar82,1);
      auVar81 = vshufps_avx(auVar82,auVar82,0xaa);
      local_12b8._16_16_ = auVar81;
      local_12b8._0_16_ = auVar81;
      auVar131 = ZEXT3264(local_12b8);
      auVar53 = vshufps_avx(auVar53,auVar53,0);
      local_12d8._16_16_ = auVar53;
      local_12d8._0_16_ = auVar53;
      auVar133 = ZEXT3264(local_12d8);
      auVar53 = vshufps_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),0);
      local_11f8._16_16_ = auVar53;
      local_11f8._0_16_ = auVar53;
      local_1420 = (ulong)(auVar82._0_4_ < 0.0) << 3;
      local_1428 = local_1420 ^ 8;
      local_1430 = (ulong)((uint)(auVar87._0_4_ < 0.0) * 8 + 0x10);
      local_1438 = local_1430 ^ 8;
      uVar50 = (ulong)((uint)(auVar92._0_4_ < 0.0) * 8 + 0x20);
      uVar49 = uVar50 ^ 8;
      local_1410 = context;
      local_1478 = uVar49;
      local_1470 = uVar50;
      do {
        if (local_1418 == stack) {
          return;
        }
        sVar47 = local_1418[-1].ptr;
        local_1418 = local_1418 + -1;
        do {
          if ((sVar47 & 8) == 0) {
            puVar42 = (ulong *)((sVar47 & 0xfffffffffffffff0) + 0x40);
            if ((sVar47 & 0xfffffffffffffff0) == 0) {
              puVar42 = (ulong *)0x0;
            }
            auVar53._8_8_ = 0;
            auVar53._0_8_ = *puVar42;
            auVar72._8_8_ = 0;
            auVar72._0_8_ = puVar42[1];
            auVar87 = vpminub_avx(auVar53,auVar72);
            auVar87 = vpcmpeqb_avx(auVar53,auVar87);
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)((long)puVar42 + 4);
            auVar83._8_8_ = 0;
            auVar83._0_8_ = *(ulong *)((long)puVar42 + 0xc);
            auVar53 = vpminub_avx(auVar59,auVar83);
            auVar53 = vpcmpeqb_avx(auVar59,auVar53);
            fVar58 = *(float *)(puVar42 + 6);
            fVar69 = *(float *)((long)puVar42 + 0x3c);
            auVar73._8_8_ = 0;
            auVar73._0_8_ = *(ulong *)((long)puVar42 + local_1420);
            auVar92 = vpmovzxbd_avx(auVar73);
            auVar94._8_8_ = 0;
            auVar94._0_8_ = *(ulong *)((long)puVar42 + local_1420 + 4);
            auVar81 = vpmovzxbd_avx(auVar94);
            auVar79._16_16_ = auVar81;
            auVar79._0_16_ = auVar92;
            auVar79 = vcvtdq2ps_avx(auVar79);
            auVar80._0_4_ = fVar58 + fVar69 * auVar79._0_4_;
            auVar80._4_4_ = fVar58 + fVar69 * auVar79._4_4_;
            auVar80._8_4_ = fVar58 + fVar69 * auVar79._8_4_;
            auVar80._12_4_ = fVar58 + fVar69 * auVar79._12_4_;
            auVar80._16_4_ = fVar58 + fVar69 * auVar79._16_4_;
            auVar80._20_4_ = fVar58 + fVar69 * auVar79._20_4_;
            auVar80._24_4_ = fVar58 + fVar69 * auVar79._24_4_;
            auVar80._28_4_ = fVar58 + auVar79._28_4_;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = *(ulong *)((long)puVar42 + local_1428);
            auVar92 = vpmovzxbd_avx(auVar95);
            auVar98._8_8_ = 0;
            auVar98._0_8_ = *(ulong *)((long)puVar42 + local_1428 + 4);
            auVar81 = vpmovzxbd_avx(auVar98);
            auVar96._16_16_ = auVar81;
            auVar96._0_16_ = auVar92;
            auVar79 = vcvtdq2ps_avx(auVar96);
            auVar86._0_4_ = fVar58 + fVar69 * auVar79._0_4_;
            auVar86._4_4_ = fVar58 + fVar69 * auVar79._4_4_;
            auVar86._8_4_ = fVar58 + fVar69 * auVar79._8_4_;
            auVar86._12_4_ = fVar58 + fVar69 * auVar79._12_4_;
            auVar86._16_4_ = fVar58 + fVar69 * auVar79._16_4_;
            auVar86._20_4_ = fVar58 + fVar69 * auVar79._20_4_;
            auVar86._24_4_ = fVar58 + fVar69 * auVar79._24_4_;
            auVar86._28_4_ = fVar58 + fVar69;
            fVar58 = *(float *)((long)puVar42 + 0x34);
            fVar69 = *(float *)(puVar42 + 8);
            auVar88._8_8_ = 0;
            auVar88._0_8_ = *(ulong *)((long)puVar42 + local_1430);
            auVar92 = vpmovzxbd_avx(auVar88);
            auVar102._8_8_ = 0;
            auVar102._0_8_ = *(ulong *)((long)puVar42 + local_1430 + 4);
            auVar81 = vpmovzxbd_avx(auVar102);
            auVar89._16_16_ = auVar81;
            auVar89._0_16_ = auVar92;
            auVar79 = vcvtdq2ps_avx(auVar89);
            auVar90._0_4_ = fVar58 + fVar69 * auVar79._0_4_;
            auVar90._4_4_ = fVar58 + fVar69 * auVar79._4_4_;
            auVar90._8_4_ = fVar58 + fVar69 * auVar79._8_4_;
            auVar90._12_4_ = fVar58 + fVar69 * auVar79._12_4_;
            auVar90._16_4_ = fVar58 + fVar69 * auVar79._16_4_;
            auVar90._20_4_ = fVar58 + fVar69 * auVar79._20_4_;
            auVar90._24_4_ = fVar58 + fVar69 * auVar79._24_4_;
            auVar90._28_4_ = fVar58 + auVar79._28_4_;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = *(ulong *)((long)puVar42 + local_1438);
            auVar92 = vpmovzxbd_avx(auVar103);
            auVar110._8_8_ = 0;
            auVar110._0_8_ = *(ulong *)((long)puVar42 + local_1438 + 4);
            auVar81 = vpmovzxbd_avx(auVar110);
            auVar107._16_16_ = auVar81;
            auVar107._0_16_ = auVar92;
            auVar79 = vcvtdq2ps_avx(auVar107);
            auVar97._0_4_ = fVar58 + fVar69 * auVar79._0_4_;
            auVar97._4_4_ = fVar58 + fVar69 * auVar79._4_4_;
            auVar97._8_4_ = fVar58 + fVar69 * auVar79._8_4_;
            auVar97._12_4_ = fVar58 + fVar69 * auVar79._12_4_;
            auVar97._16_4_ = fVar58 + fVar69 * auVar79._16_4_;
            auVar97._20_4_ = fVar58 + fVar69 * auVar79._20_4_;
            auVar97._24_4_ = fVar58 + fVar69 * auVar79._24_4_;
            auVar97._28_4_ = fVar58 + fVar69;
            auVar99._8_8_ = 0;
            auVar99._0_8_ = *(ulong *)((long)puVar42 + uVar50);
            auVar92 = vpmovzxbd_avx(auVar99);
            auVar104._8_8_ = 0;
            auVar104._0_8_ = *(ulong *)((long)puVar42 + uVar50 + 4);
            auVar81 = vpmovzxbd_avx(auVar104);
            auVar100._16_16_ = auVar81;
            auVar100._0_16_ = auVar92;
            auVar105._8_8_ = 0;
            auVar105._0_8_ = *(ulong *)((long)puVar42 + uVar49);
            auVar92 = vpmovzxbd_avx(auVar105);
            auVar111._8_8_ = 0;
            auVar111._0_8_ = *(ulong *)((long)puVar42 + uVar49 + 4);
            auVar81 = vpmovzxbd_avx(auVar111);
            auVar108._16_16_ = auVar81;
            auVar108._0_16_ = auVar92;
            fVar58 = *(float *)((long)puVar42 + 0x44);
            auVar79 = vcvtdq2ps_avx(auVar100);
            auVar4 = vcvtdq2ps_avx(auVar108);
            fVar69 = *(float *)(puVar42 + 7);
            auVar101._0_4_ = fVar69 + fVar58 * auVar79._0_4_;
            auVar101._4_4_ = fVar69 + fVar58 * auVar79._4_4_;
            auVar101._8_4_ = fVar69 + fVar58 * auVar79._8_4_;
            auVar101._12_4_ = fVar69 + fVar58 * auVar79._12_4_;
            auVar101._16_4_ = fVar69 + fVar58 * auVar79._16_4_;
            auVar101._20_4_ = fVar69 + fVar58 * auVar79._20_4_;
            auVar101._24_4_ = fVar69 + fVar58 * auVar79._24_4_;
            auVar101._28_4_ = fVar69 + auVar79._28_4_;
            auVar109._0_4_ = fVar69 + fVar58 * auVar4._0_4_;
            auVar109._4_4_ = fVar69 + fVar58 * auVar4._4_4_;
            auVar109._8_4_ = fVar69 + fVar58 * auVar4._8_4_;
            auVar109._12_4_ = fVar69 + fVar58 * auVar4._12_4_;
            auVar109._16_4_ = fVar69 + fVar58 * auVar4._16_4_;
            auVar109._20_4_ = fVar69 + fVar58 * auVar4._20_4_;
            auVar109._24_4_ = fVar69 + fVar58 * auVar4._24_4_;
            auVar109._28_4_ = fVar69 + auVar4._28_4_;
            auVar79 = vsubps_avx(auVar80,auVar114._0_32_);
            auVar4._4_4_ = auVar128._4_4_ * auVar79._4_4_;
            auVar4._0_4_ = auVar128._0_4_ * auVar79._0_4_;
            auVar4._8_4_ = auVar128._8_4_ * auVar79._8_4_;
            auVar4._12_4_ = auVar128._12_4_ * auVar79._12_4_;
            auVar4._16_4_ = auVar128._16_4_ * auVar79._16_4_;
            auVar4._20_4_ = auVar128._20_4_ * auVar79._20_4_;
            auVar4._24_4_ = auVar128._24_4_ * auVar79._24_4_;
            auVar4._28_4_ = auVar79._28_4_;
            auVar79 = vsubps_avx(auVar90,auVar118._0_32_);
            auVar15._4_4_ = auVar129._4_4_ * auVar79._4_4_;
            auVar15._0_4_ = auVar129._0_4_ * auVar79._0_4_;
            auVar15._8_4_ = auVar129._8_4_ * auVar79._8_4_;
            auVar15._12_4_ = auVar129._12_4_ * auVar79._12_4_;
            auVar15._16_4_ = auVar129._16_4_ * auVar79._16_4_;
            auVar15._20_4_ = auVar129._20_4_ * auVar79._20_4_;
            auVar15._24_4_ = auVar129._24_4_ * auVar79._24_4_;
            auVar15._28_4_ = auVar79._28_4_;
            auVar79 = vmaxps_avx(auVar4,auVar15);
            auVar4 = vsubps_avx(auVar101,auVar120._0_32_);
            auVar16._4_4_ = auVar131._4_4_ * auVar4._4_4_;
            auVar16._0_4_ = auVar131._0_4_ * auVar4._0_4_;
            auVar16._8_4_ = auVar131._8_4_ * auVar4._8_4_;
            auVar16._12_4_ = auVar131._12_4_ * auVar4._12_4_;
            auVar16._16_4_ = auVar131._16_4_ * auVar4._16_4_;
            auVar16._20_4_ = auVar131._20_4_ * auVar4._20_4_;
            auVar16._24_4_ = auVar131._24_4_ * auVar4._24_4_;
            auVar16._28_4_ = auVar4._28_4_;
            auVar4 = vmaxps_avx(auVar16,auVar133._0_32_);
            auVar79 = vmaxps_avx(auVar79,auVar4);
            auVar4 = vsubps_avx(auVar86,auVar114._0_32_);
            auVar17._4_4_ = auVar128._4_4_ * auVar4._4_4_;
            auVar17._0_4_ = auVar128._0_4_ * auVar4._0_4_;
            auVar17._8_4_ = auVar128._8_4_ * auVar4._8_4_;
            auVar17._12_4_ = auVar128._12_4_ * auVar4._12_4_;
            auVar17._16_4_ = auVar128._16_4_ * auVar4._16_4_;
            auVar17._20_4_ = auVar128._20_4_ * auVar4._20_4_;
            auVar17._24_4_ = auVar128._24_4_ * auVar4._24_4_;
            auVar17._28_4_ = auVar4._28_4_;
            auVar4 = vsubps_avx(auVar97,auVar118._0_32_);
            auVar18._4_4_ = auVar129._4_4_ * auVar4._4_4_;
            auVar18._0_4_ = auVar129._0_4_ * auVar4._0_4_;
            auVar18._8_4_ = auVar129._8_4_ * auVar4._8_4_;
            auVar18._12_4_ = auVar129._12_4_ * auVar4._12_4_;
            auVar18._16_4_ = auVar129._16_4_ * auVar4._16_4_;
            auVar18._20_4_ = auVar129._20_4_ * auVar4._20_4_;
            auVar18._24_4_ = auVar129._24_4_ * auVar4._24_4_;
            auVar18._28_4_ = auVar4._28_4_;
            auVar4 = vminps_avx(auVar17,auVar18);
            auVar15 = vsubps_avx(auVar109,auVar120._0_32_);
            auVar19._4_4_ = auVar131._4_4_ * auVar15._4_4_;
            auVar19._0_4_ = auVar131._0_4_ * auVar15._0_4_;
            auVar19._8_4_ = auVar131._8_4_ * auVar15._8_4_;
            auVar19._12_4_ = auVar131._12_4_ * auVar15._12_4_;
            auVar19._16_4_ = auVar131._16_4_ * auVar15._16_4_;
            auVar19._20_4_ = auVar131._20_4_ * auVar15._20_4_;
            auVar19._24_4_ = auVar131._24_4_ * auVar15._24_4_;
            auVar19._28_4_ = auVar15._28_4_;
            auVar15 = vminps_avx(auVar19,local_11f8);
            auVar4 = vminps_avx(auVar4,auVar15);
            auVar79 = vcmpps_avx(auVar79,auVar4,2);
            auVar92 = vpcmpeqd_avx(auVar4._0_16_,auVar4._0_16_);
            auVar87 = vpmovsxbd_avx(auVar87 ^ auVar92);
            auVar53 = vpmovsxbd_avx(auVar53 ^ auVar92);
            auVar57._16_16_ = auVar53;
            auVar57._0_16_ = auVar87;
            auVar4 = vcvtdq2ps_avx(auVar57);
            auVar68._8_4_ = 0xbf800000;
            auVar68._0_8_ = 0xbf800000bf800000;
            auVar68._12_4_ = 0xbf800000;
            auVar68._16_4_ = 0xbf800000;
            auVar68._20_4_ = 0xbf800000;
            auVar68._24_4_ = 0xbf800000;
            auVar68._28_4_ = 0xbf800000;
            auVar4 = vcmpps_avx(auVar68,auVar4,1);
            auVar79 = vandps_avx(auVar79,auVar4);
            uVar45 = vmovmskps_avx(auVar79);
            unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar45);
          }
          if ((sVar47 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar44 = 4;
            }
            else {
              uVar46 = sVar47 & 0xfffffffffffffff0;
              lVar51 = 0;
              if (unaff_RBX != 0) {
                for (; (unaff_RBX >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                }
              }
              iVar44 = 0;
              sVar47 = *(size_t *)(uVar46 + lVar51 * 8);
              uVar48 = unaff_RBX - 1 & unaff_RBX;
              if (uVar48 != 0) {
                local_1418->ptr = sVar47;
                lVar51 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                  }
                }
                uVar43 = uVar48 - 1;
                while( true ) {
                  local_1418 = local_1418 + 1;
                  sVar47 = *(size_t *)(uVar46 + lVar51 * 8);
                  uVar43 = uVar43 & uVar48;
                  if (uVar43 == 0) break;
                  local_1418->ptr = sVar47;
                  lVar51 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                    }
                  }
                  uVar48 = uVar43 - 1;
                }
                iVar44 = 0;
              }
            }
          }
          else {
            iVar44 = 6;
          }
        } while (iVar44 == 0);
        if (iVar44 == 6) {
          local_1440 = (ulong)((uint)sVar47 & 0xf) - 8;
          bVar52 = local_1440 != 0;
          if (bVar52) {
            uVar49 = sVar47 & 0xfffffffffffffff0;
            uVar50 = 0;
            do {
              lVar51 = uVar50 * 0xb0;
              pfVar1 = (float *)(uVar49 + 0x80 + lVar51);
              fVar20 = *pfVar1;
              fVar21 = pfVar1[1];
              fVar22 = pfVar1[2];
              fVar23 = pfVar1[3];
              pfVar1 = (float *)(uVar49 + 0x40 + lVar51);
              fVar24 = *pfVar1;
              fVar25 = pfVar1[1];
              fVar26 = pfVar1[2];
              fVar27 = pfVar1[3];
              auVar54._0_4_ = fVar20 * fVar24;
              auVar54._4_4_ = fVar21 * fVar25;
              auVar54._8_4_ = fVar22 * fVar26;
              auVar54._12_4_ = fVar23 * fVar27;
              pfVar1 = (float *)(uVar49 + 0x70 + lVar51);
              fVar28 = *pfVar1;
              fVar29 = pfVar1[1];
              fVar30 = pfVar1[2];
              fVar31 = pfVar1[3];
              pfVar1 = (float *)(uVar49 + 0x50 + lVar51);
              fVar32 = *pfVar1;
              fVar33 = pfVar1[1];
              fVar34 = pfVar1[2];
              fVar35 = pfVar1[3];
              auVar60._0_4_ = fVar28 * fVar32;
              auVar60._4_4_ = fVar29 * fVar33;
              auVar60._8_4_ = fVar30 * fVar34;
              auVar60._12_4_ = fVar31 * fVar35;
              local_14c8 = vsubps_avx(auVar60,auVar54);
              auVar87 = *(undefined1 (*) [16])(uVar49 + 0x60 + lVar51);
              fVar119 = auVar87._0_4_;
              auVar61._0_4_ = fVar119 * fVar32;
              fVar121 = auVar87._4_4_;
              auVar61._4_4_ = fVar121 * fVar33;
              fVar122 = auVar87._8_4_;
              auVar61._8_4_ = fVar122 * fVar34;
              fVar123 = auVar87._12_4_;
              auVar61._12_4_ = fVar123 * fVar35;
              pfVar1 = (float *)(uVar49 + 0x30 + lVar51);
              fVar36 = *pfVar1;
              fVar37 = pfVar1[1];
              fVar38 = pfVar1[2];
              fVar39 = pfVar1[3];
              auVar74._0_4_ = fVar20 * fVar36;
              auVar74._4_4_ = fVar21 * fVar37;
              auVar74._8_4_ = fVar22 * fVar38;
              auVar74._12_4_ = fVar23 * fVar39;
              local_1498 = vsubps_avx(auVar74,auVar61);
              auVar75._0_4_ = fVar28 * fVar36;
              auVar75._4_4_ = fVar29 * fVar37;
              auVar75._8_4_ = fVar30 * fVar38;
              auVar75._12_4_ = fVar31 * fVar39;
              auVar124._0_4_ = fVar119 * fVar24;
              auVar124._4_4_ = fVar121 * fVar25;
              auVar124._8_4_ = fVar122 * fVar26;
              auVar124._12_4_ = fVar123 * fVar27;
              local_14a8 = vsubps_avx(auVar124,auVar75);
              uVar45 = *(undefined4 *)&(ray->org).field_0;
              auVar125._4_4_ = uVar45;
              auVar125._0_4_ = uVar45;
              auVar125._8_4_ = uVar45;
              auVar125._12_4_ = uVar45;
              auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + lVar51),auVar125);
              uVar45 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar126._4_4_ = uVar45;
              auVar126._0_4_ = uVar45;
              auVar126._8_4_ = uVar45;
              auVar126._12_4_ = uVar45;
              local_1488 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x10 + lVar51),auVar126);
              uVar45 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar127._4_4_ = uVar45;
              auVar127._0_4_ = uVar45;
              auVar127._8_4_ = uVar45;
              auVar127._12_4_ = uVar45;
              local_1468 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + lVar51),auVar127);
              fVar58 = (ray->dir).field_0.m128[1];
              fVar69 = (ray->dir).field_0.m128[2];
              fVar71 = local_1468._0_4_;
              auVar130._0_4_ = fVar58 * fVar71;
              fVar6 = local_1468._4_4_;
              auVar130._4_4_ = fVar58 * fVar6;
              fVar9 = local_1468._8_4_;
              auVar130._8_4_ = fVar58 * fVar9;
              fVar12 = local_1468._12_4_;
              auVar130._12_4_ = fVar58 * fVar12;
              fVar91 = local_1488._0_4_;
              auVar132._0_4_ = fVar69 * fVar91;
              fVar7 = local_1488._4_4_;
              auVar132._4_4_ = fVar69 * fVar7;
              fVar10 = local_1488._8_4_;
              auVar132._8_4_ = fVar69 * fVar10;
              fVar13 = local_1488._12_4_;
              auVar132._12_4_ = fVar69 * fVar13;
              auVar53 = vsubps_avx(auVar132,auVar130);
              fVar70 = (ray->dir).field_0.m128[0];
              fVar5 = auVar81._0_4_;
              auVar55._0_4_ = fVar69 * fVar5;
              fVar8 = auVar81._4_4_;
              auVar55._4_4_ = fVar69 * fVar8;
              fVar11 = auVar81._8_4_;
              auVar55._8_4_ = fVar69 * fVar11;
              fVar14 = auVar81._12_4_;
              auVar55._12_4_ = fVar69 * fVar14;
              auVar62._0_4_ = fVar70 * fVar71;
              auVar62._4_4_ = fVar70 * fVar6;
              auVar62._8_4_ = fVar70 * fVar9;
              auVar62._12_4_ = fVar70 * fVar12;
              auVar92 = vsubps_avx(auVar62,auVar55);
              auVar63._0_4_ = fVar70 * fVar91;
              auVar63._4_4_ = fVar70 * fVar7;
              auVar63._8_4_ = fVar70 * fVar10;
              auVar63._12_4_ = fVar70 * fVar13;
              auVar76._0_4_ = fVar58 * fVar5;
              auVar76._4_4_ = fVar58 * fVar8;
              auVar76._8_4_ = fVar58 * fVar11;
              auVar76._12_4_ = fVar58 * fVar14;
              auVar82 = vsubps_avx(auVar76,auVar63);
              auVar77._0_4_ =
                   local_14c8._0_4_ * fVar70 + fVar58 * local_1498._0_4_ + fVar69 * local_14a8._0_4_
              ;
              auVar77._4_4_ =
                   local_14c8._4_4_ * fVar70 + fVar58 * local_1498._4_4_ + fVar69 * local_14a8._4_4_
              ;
              auVar77._8_4_ =
                   local_14c8._8_4_ * fVar70 + fVar58 * local_1498._8_4_ + fVar69 * local_14a8._8_4_
              ;
              auVar77._12_4_ =
                   local_14c8._12_4_ * fVar70 +
                   fVar58 * local_1498._12_4_ + fVar69 * local_14a8._12_4_;
              auVar64._8_8_ = 0x8000000080000000;
              auVar64._0_8_ = 0x8000000080000000;
              auVar87 = vandps_avx(auVar77,auVar64);
              uVar113 = auVar87._0_4_;
              auVar106._0_4_ =
                   (float)(uVar113 ^
                          (uint)(fVar119 * auVar53._0_4_ +
                                fVar20 * auVar82._0_4_ + fVar28 * auVar92._0_4_));
              uVar115 = auVar87._4_4_;
              auVar106._4_4_ =
                   (float)(uVar115 ^
                          (uint)(fVar121 * auVar53._4_4_ +
                                fVar21 * auVar82._4_4_ + fVar29 * auVar92._4_4_));
              uVar116 = auVar87._8_4_;
              auVar106._8_4_ =
                   (float)(uVar116 ^
                          (uint)(fVar122 * auVar53._8_4_ +
                                fVar22 * auVar82._8_4_ + fVar30 * auVar92._8_4_));
              uVar117 = auVar87._12_4_;
              auVar106._12_4_ =
                   (float)(uVar117 ^
                          (uint)(fVar123 * auVar53._12_4_ +
                                fVar23 * auVar82._12_4_ + fVar31 * auVar92._12_4_));
              auVar112._0_4_ =
                   (float)(uVar113 ^
                          (uint)(fVar36 * auVar53._0_4_ +
                                fVar32 * auVar82._0_4_ + fVar24 * auVar92._0_4_));
              auVar112._4_4_ =
                   (float)(uVar115 ^
                          (uint)(fVar37 * auVar53._4_4_ +
                                fVar33 * auVar82._4_4_ + fVar25 * auVar92._4_4_));
              auVar112._8_4_ =
                   (float)(uVar116 ^
                          (uint)(fVar38 * auVar53._8_4_ +
                                fVar34 * auVar82._8_4_ + fVar26 * auVar92._8_4_));
              auVar112._12_4_ =
                   (float)(uVar117 ^
                          (uint)(fVar39 * auVar53._12_4_ +
                                fVar35 * auVar82._12_4_ + fVar27 * auVar92._12_4_));
              auVar92 = ZEXT416(0) << 0x20;
              auVar87 = vcmpps_avx(auVar106,auVar92,5);
              auVar53 = vcmpps_avx(auVar112,auVar92,5);
              auVar87 = vandps_avx(auVar87,auVar53);
              auVar65._8_4_ = 0x7fffffff;
              auVar65._0_8_ = 0x7fffffff7fffffff;
              auVar65._12_4_ = 0x7fffffff;
              auVar53 = vandps_avx(auVar77,auVar65);
              auVar92 = vcmpps_avx(auVar92,auVar77,4);
              auVar87 = vandps_avx(auVar87,auVar92);
              auVar66._0_4_ = auVar112._0_4_ + auVar106._0_4_;
              auVar66._4_4_ = auVar112._4_4_ + auVar106._4_4_;
              auVar66._8_4_ = auVar112._8_4_ + auVar106._8_4_;
              auVar66._12_4_ = auVar112._12_4_ + auVar106._12_4_;
              auVar92 = vcmpps_avx(auVar66,auVar53,2);
              auVar87 = vandps_avx(auVar87,auVar92);
              auVar92 = auVar41 & auVar87;
              if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar92[0xf] < '\0') {
                auVar87 = vandps_avx(auVar87,auVar41);
                auVar84._0_4_ =
                     (float)(uVar113 ^
                            (uint)(local_14c8._0_4_ * fVar5 +
                                  fVar91 * local_1498._0_4_ + fVar71 * local_14a8._0_4_));
                auVar84._4_4_ =
                     (float)(uVar115 ^
                            (uint)(local_14c8._4_4_ * fVar8 +
                                  fVar7 * local_1498._4_4_ + fVar6 * local_14a8._4_4_));
                auVar84._8_4_ =
                     (float)(uVar116 ^
                            (uint)(local_14c8._8_4_ * fVar11 +
                                  fVar10 * local_1498._8_4_ + fVar9 * local_14a8._8_4_));
                auVar84._12_4_ =
                     (float)(uVar117 ^
                            (uint)(local_14c8._12_4_ * fVar14 +
                                  fVar13 * local_1498._12_4_ + fVar12 * local_14a8._12_4_));
                fVar58 = (ray->org).field_0.m128[3];
                fVar69 = auVar53._0_4_;
                auVar56._0_4_ = fVar69 * fVar58;
                fVar70 = auVar53._4_4_;
                auVar56._4_4_ = fVar70 * fVar58;
                fVar71 = auVar53._8_4_;
                auVar56._8_4_ = fVar71 * fVar58;
                fVar91 = auVar53._12_4_;
                auVar56._12_4_ = fVar91 * fVar58;
                auVar92 = vcmpps_avx(auVar56,auVar84,1);
                fVar58 = ray->tfar;
                auVar67._0_4_ = fVar69 * fVar58;
                auVar67._4_4_ = fVar70 * fVar58;
                auVar67._8_4_ = fVar71 * fVar58;
                auVar67._12_4_ = fVar91 * fVar58;
                auVar82 = vcmpps_avx(auVar84,auVar67,2);
                auVar92 = vandps_avx(auVar82,auVar92);
                auVar82 = auVar87 & auVar92;
                if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar82[0xf] < '\0') {
                  auVar87 = vandps_avx(auVar87,auVar92);
                  local_1308 = local_14c8;
                  local_12f8 = local_1498._0_8_;
                  uStack_12f0 = local_1498._8_8_;
                  local_12e8 = local_14a8._0_8_;
                  uStack_12e0 = local_14a8._8_8_;
                  uStack_1450 = auVar81._8_8_;
                  local_1458 = local_1410->scene;
                  auVar53 = vrcpps_avx(auVar53);
                  fVar58 = auVar53._0_4_;
                  auVar78._0_4_ = fVar69 * fVar58;
                  fVar69 = auVar53._4_4_;
                  auVar78._4_4_ = fVar70 * fVar69;
                  fVar70 = auVar53._8_4_;
                  auVar78._8_4_ = fVar71 * fVar70;
                  fVar71 = auVar53._12_4_;
                  auVar78._12_4_ = fVar91 * fVar71;
                  auVar85._8_4_ = 0x3f800000;
                  auVar85._0_8_ = &DAT_3f8000003f800000;
                  auVar85._12_4_ = 0x3f800000;
                  auVar53 = vsubps_avx(auVar85,auVar78);
                  fVar58 = fVar58 + fVar58 * auVar53._0_4_;
                  fVar69 = fVar69 + fVar69 * auVar53._4_4_;
                  fVar70 = fVar70 + fVar70 * auVar53._8_4_;
                  fVar71 = fVar71 + fVar71 * auVar53._12_4_;
                  local_1318[0] = fVar58 * auVar84._0_4_;
                  local_1318[1] = fVar69 * auVar84._4_4_;
                  local_1318[2] = fVar70 * auVar84._8_4_;
                  local_1318[3] = fVar71 * auVar84._12_4_;
                  local_1338._0_4_ = fVar58 * auVar106._0_4_;
                  local_1338._4_4_ = fVar69 * auVar106._4_4_;
                  local_1338._8_4_ = fVar70 * auVar106._8_4_;
                  local_1338._12_4_ = fVar71 * auVar106._12_4_;
                  local_1328._0_4_ = fVar58 * auVar112._0_4_;
                  local_1328._4_4_ = fVar69 * auVar112._4_4_;
                  local_1328._8_4_ = fVar70 * auVar112._8_4_;
                  local_1328._12_4_ = fVar71 * auVar112._12_4_;
                  uVar45 = vmovmskps_avx(auVar87);
                  uVar46 = CONCAT44((int)((ulong)local_1410->scene >> 0x20),uVar45);
                  do {
                    local_14c8._0_8_ = uVar46;
                    uVar48 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                      }
                    }
                    local_14a8._0_8_ = uVar48;
                    h.geomID = *(uint *)(lVar51 + uVar49 + 0x90 + uVar48 * 4);
                    local_1488._0_8_ = CONCAT44(0,h.geomID);
                    lVar3 = *(long *)(*(long *)((long)local_1458 + 0x1e8) + CONCAT44(0,h.geomID) * 8
                                     );
                    local_1498._0_8_ = lVar3;
                    if ((*(uint *)(lVar3 + 0x34) & ray->mask) == 0) {
                      local_14c8._0_8_ = uVar46 ^ 1L << (uVar48 & 0x3f);
                      bVar40 = true;
                    }
                    else {
                      local_1468._0_8_ = local_1410->args;
                      if ((local_1410->args->filter == (RTCFilterFunctionN)0x0) &&
                         (*(long *)(lVar3 + 0x48) == 0)) {
                        bVar40 = false;
                      }
                      else {
                        h.u = *(float *)(local_1338 + uVar48 * 4);
                        h.v = *(float *)(local_1328 + uVar48 * 4);
                        args.context = local_1410->user;
                        h.primID = *(uint *)(lVar51 + uVar49 + 0xa0 + uVar48 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar48 * 4);
                        h.Ng.field_0.field_0.y = *(float *)((long)&local_12f8 + uVar48 * 4);
                        h.Ng.field_0.field_0.z = *(float *)((long)&local_12e8 + uVar48 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_1488._0_4_ = ray->tfar;
                        ray->tfar = local_1318[uVar48];
                        local_14ac = -1;
                        args.valid = &local_14ac;
                        args.geometryUserPtr = *(void **)(lVar3 + 0x18);
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if ((*(code **)(lVar3 + 0x48) == (code *)0x0) ||
                           ((**(code **)(lVar3 + 0x48))(&args), *args.valid != 0)) {
                          if (*(code **)(local_1468._0_8_ + 0x10) != (code *)0x0) {
                            if (((*(byte *)local_1468._0_8_ & 2) != 0) ||
                               ((*(byte *)(local_1498._0_8_ + 0x3e) & 0x40) != 0)) {
                              (**(code **)(local_1468._0_8_ + 0x10))(&args);
                            }
                            if (*args.valid == 0) goto LAB_00310a58;
                          }
                          bVar40 = false;
                        }
                        else {
LAB_00310a58:
                          ray->tfar = (float)local_1488._0_4_;
                          local_14c8._0_8_ = uVar46 ^ 1L << (local_14a8._0_8_ & 0x3f);
                          bVar40 = true;
                        }
                      }
                    }
                    iVar44 = 0;
                    if (!bVar40) {
                      auVar114 = ZEXT3264(local_1218);
                      auVar118 = ZEXT3264(local_1238);
                      auVar120 = ZEXT3264(local_1258);
                      auVar128 = ZEXT3264(local_1278);
                      auVar129 = ZEXT3264(local_1298);
                      auVar131 = ZEXT3264(local_12b8);
                      auVar133 = ZEXT3264(local_12d8);
                      uVar49 = local_1478;
                      uVar50 = local_1470;
                      if (bVar52) {
                        ray->tfar = -INFINITY;
                        iVar44 = 3;
                      }
                      goto LAB_00310b07;
                    }
                    uVar46 = local_14c8._0_8_;
                  } while (local_14c8._0_8_ != 0);
                }
              }
              uVar50 = uVar50 + 1;
              bVar52 = uVar50 < local_1440;
            } while (uVar50 != local_1440);
            auVar114 = ZEXT3264(local_1218);
            auVar118 = ZEXT3264(local_1238);
            auVar120 = ZEXT3264(local_1258);
            auVar128 = ZEXT3264(local_1278);
            auVar129 = ZEXT3264(local_1298);
            auVar131 = ZEXT3264(local_12b8);
            auVar133 = ZEXT3264(local_12d8);
            uVar49 = local_1478;
            uVar50 = local_1470;
          }
          iVar44 = 0;
        }
LAB_00310b07:
      } while (iVar44 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }